

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# determinization.cc
# Opt level: O0

void __thiscall re2c::dfa_t::dfa_t(dfa_t *this,nfa_t *nfa,charset_t *charset,rules_t *rules)

{
  type_t tVar1;
  uint32_t uVar2;
  value_type pdVar3;
  undefined1 auVar4 [16];
  const_iterator cP;
  pointer kernel_00;
  bool bVar5;
  uint32_t uVar6;
  size_type sVar7;
  nfa_state_t **end_00;
  dfa_state_t *pdVar8;
  dfa_state_t *pdVar9;
  const_reference pvVar10;
  reference pvVar11;
  mapped_type *this_00;
  ulong uVar12;
  nfa_state_t *pnVar13;
  reference ppnVar14;
  size_t sVar15;
  reference ppdVar16;
  reference ppRVar17;
  mapped_type *pmVar18;
  RuleOp *rule_1;
  _Self local_1a0;
  const_iterator j_3;
  RuleOp *rule;
  _Self local_188;
  const_iterator j_2;
  set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_> *rs;
  dfa_state_t *s_1;
  size_t i_1;
  size_t count;
  size_t c_2;
  __normal_iterator<re2c::nfa_state_t_**,_std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>
  local_150;
  __normal_iterator<re2c::nfa_state_t_*const_*,_std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>
  local_148;
  const_iterator j_1;
  nfa_state_t **end;
  size_t c_1;
  Range *local_120;
  Range *r;
  size_t c;
  nfa_state_t *m;
  nfa_state_t *n;
  size_t j;
  size_t kernel_size;
  nfa_state_t **kernel;
  dfa_state_t *s;
  size_t i;
  undefined1 local_d0 [8];
  vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
  arcs;
  nfa_state_t **buffer;
  undefined1 local_a0 [8];
  ord_hash_set_t kernels;
  map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
  s2rules;
  rules_t *rules_local;
  charset_t *charset_local;
  nfa_t *nfa_local;
  dfa_t *this_local;
  
  (this->states).super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->states).super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->states).super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::vector(&this->states);
  sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(charset);
  this->nchars = sVar7 - 1;
  std::
  map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
  ::map((map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
         *)&kernels.lookup._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ord_hash_set_t::ord_hash_set_t((ord_hash_set_t *)local_a0);
  arcs.
  super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)operator_new__((ulong)nfa->size << 3);
  sVar7 = this->nchars;
  std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>::allocator
            ((allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_> *)
             ((long)&i + 7));
  std::
  vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
  ::vector((vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
            *)local_d0,sVar7,
           (allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_> *)
           ((long)&i + 7));
  std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>::
  ~allocator((allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_> *)
             ((long)&i + 7));
  kernel_00 = arcs.
              super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  end_00 = closure((nfa_state_t **)
                   arcs.
                   super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,nfa->root);
  find_state((nfa_state_t **)kernel_00,end_00,(ord_hash_set_t *)local_a0);
  for (s = (dfa_state_t *)0x0; pdVar9 = s,
      pdVar8 = (dfa_state_t *)ord_hash_set_t::size((ord_hash_set_t *)local_a0), pdVar9 < pdVar8;
      s = (dfa_state_t *)((long)&s->arcs + 1)) {
    pdVar9 = (dfa_state_t *)operator_new(0x18);
    dfa_state_t::dfa_state_t(pdVar9);
    kernel = (nfa_state_t **)pdVar9;
    std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::push_back
              (&this->states,(value_type *)&kernel);
    j = ord_hash_set_t::deref<re2c::nfa_state_t*>
                  ((ord_hash_set_t *)local_a0,(size_t)s,(nfa_state_t ***)&kernel_size);
    for (n = (nfa_state_t *)0x0; n < j; n = (nfa_state_t *)((long)&n->type + 1)) {
      m = *(nfa_state_t **)(kernel_size + (long)n * 8);
      tVar1 = m->type;
      if (tVar1 == RAN) {
        c = (size_t)(m->value).alt.out1;
        r = (Range *)0x0;
        for (local_120 = (m->value).ran.ran; local_120 != (Range *)0x0;
            local_120 = Range::next(local_120)) {
          while( true ) {
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (charset,(size_type)r);
            uVar2 = *pvVar10;
            uVar6 = Range::lower(local_120);
            if (uVar2 == uVar6) break;
            r = (Range *)((long)&r->nx + 1);
          }
          while( true ) {
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (charset,(size_type)r);
            uVar2 = *pvVar10;
            uVar6 = Range::upper(local_120);
            if (uVar2 == uVar6) break;
            pvVar11 = std::
                      vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                      ::operator[]((vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                                    *)local_d0,(size_type)r);
            std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>::push_back
                      (pvVar11,(value_type *)&c);
            r = (Range *)((long)&r->nx + 1);
          }
        }
      }
      else if (tVar1 == CTX) {
        *(undefined1 *)(kernel + 2) = 1;
      }
      else if (tVar1 == FIN) {
        this_00 = std::
                  map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
                  ::operator[]((map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
                                *)&kernels.lookup._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (key_type_conflict *)&s);
        std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>::insert
                  (this_00,(value_type *)&(m->value).ctx);
      }
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = this->nchars;
    uVar12 = SUB168(auVar4 * ZEXT816(8),0);
    if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    pnVar13 = (nfa_state_t *)operator_new__(uVar12);
    *kernel = pnVar13;
    for (end = (nfa_state_t **)0x0; end < (nfa_state_t **)this->nchars;
        end = (nfa_state_t **)((long)end + 1)) {
      j_1._M_current =
           (nfa_state_t **)
           arcs.
           super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar11 = std::
                vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                ::operator[]((vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                              *)local_d0,(size_type)end);
      local_150._M_current =
           (nfa_state_t **)
           std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>::begin(pvVar11);
      __gnu_cxx::
      __normal_iterator<re2c::nfa_state_t*const*,std::vector<re2c::nfa_state_t*,std::allocator<re2c::nfa_state_t*>>>
      ::__normal_iterator<re2c::nfa_state_t**>
                ((__normal_iterator<re2c::nfa_state_t*const*,std::vector<re2c::nfa_state_t*,std::allocator<re2c::nfa_state_t*>>>
                  *)&local_148,&local_150);
      while( true ) {
        pvVar11 = std::
                  vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                  ::operator[]((vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                                *)local_d0,(size_type)end);
        c_2 = (size_t)std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>::end
                                (pvVar11);
        bVar5 = __gnu_cxx::operator!=
                          (&local_148,
                           (__normal_iterator<re2c::nfa_state_t_**,_std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>
                            *)&c_2);
        cP = j_1;
        if (!bVar5) break;
        ppnVar14 = __gnu_cxx::
                   __normal_iterator<re2c::nfa_state_t_*const_*,_std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>
                   ::operator*(&local_148);
        j_1._M_current = closure(cP._M_current,*ppnVar14);
        __gnu_cxx::
        __normal_iterator<re2c::nfa_state_t_*const_*,_std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>
        ::operator++(&local_148);
      }
      sVar15 = find_state((nfa_state_t **)
                          arcs.
                          super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,j_1._M_current,
                          (ord_hash_set_t *)local_a0);
      *(size_t *)(&(*kernel)->type + (long)end * 2) = sVar15;
    }
    for (count = 0; count < this->nchars; count = count + 1) {
      pvVar11 = std::
                vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                ::operator[]((vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                              *)local_d0,count);
      std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>::clear(pvVar11);
    }
  }
  if (arcs.
      super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete__(arcs.
                      super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  i_1 = std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::size(&this->states);
  for (s_1 = (dfa_state_t *)0x0; s_1 < i_1; s_1 = (dfa_state_t *)((long)&s_1->arcs + 1)) {
    ppdVar16 = std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::operator[]
                         (&this->states,(size_type)s_1);
    pdVar3 = *ppdVar16;
    j_2._M_node = (_Base_ptr)
                  std::
                  map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
                  ::operator[]((map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
                                *)&kernels.lookup._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (key_type_conflict *)&s_1);
    local_188._M_node =
         (_Base_ptr)
         std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>::begin
                   ((set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>
                     *)j_2._M_node);
    while( true ) {
      rule = (RuleOp *)
             std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>::
             end((set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_> *)
                 j_2._M_node);
      bVar5 = std::operator!=(&local_188,(_Self *)&rule);
      if (!bVar5) break;
      ppRVar17 = std::_Rb_tree_const_iterator<re2c::RuleOp_*>::operator*(&local_188);
      j_3._M_node = (_Base_ptr)*ppRVar17;
      if ((pdVar3->rule == (RuleOp *)0x0) ||
         (bVar5 = rule_rank_t::operator<(&((RuleOp *)j_3._M_node)->rank,&pdVar3->rule->rank), bVar5)
         ) {
        pdVar3->rule = (RuleOp *)j_3._M_node;
      }
      std::_Rb_tree_const_iterator<re2c::RuleOp_*>::operator++(&local_188);
    }
    local_1a0._M_node =
         (_Base_ptr)
         std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>::begin
                   (j_2._M_node);
    while( true ) {
      rule_1 = (RuleOp *)
               std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>
               ::end((set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>
                      *)j_2._M_node);
      bVar5 = std::operator!=(&local_1a0,(_Self *)&rule_1);
      if (!bVar5) break;
      ppRVar17 = std::_Rb_tree_const_iterator<re2c::RuleOp_*>::operator*(&local_1a0);
      if (pdVar3->rule != *ppRVar17) {
        pmVar18 = std::
                  map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
                  ::operator[](rules,&(*ppRVar17)->rank);
        std::
        set<re2c::rule_rank_t,_std::less<re2c::rule_rank_t>,_std::allocator<re2c::rule_rank_t>_>::
        insert(&pmVar18->shadow,&pdVar3->rule->rank);
      }
      std::_Rb_tree_const_iterator<re2c::RuleOp_*>::operator++(&local_1a0);
    }
  }
  std::
  vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
  ::~vector((vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
             *)local_d0);
  ord_hash_set_t::~ord_hash_set_t((ord_hash_set_t *)local_a0);
  std::
  map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
  ::~map((map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
          *)&kernels.lookup._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

dfa_t::dfa_t(const nfa_t &nfa, const charset_t &charset, rules_t &rules)
	: states()
	, nchars(charset.size() - 1) // (n + 1) bounds for n ranges
{
	std::map<size_t, std::set<RuleOp*> > s2rules;
	ord_hash_set_t kernels;
	nfa_state_t **const buffer = new nfa_state_t*[nfa.size];
	std::vector<std::vector<nfa_state_t*> > arcs(nchars);

	find_state(buffer, closure(buffer, nfa.root), kernels);
	for (size_t i = 0; i < kernels.size(); ++i)
	{
		dfa_state_t *s = new dfa_state_t;
		states.push_back(s);

		nfa_state_t **kernel;
		const size_t kernel_size = kernels.deref<nfa_state_t*>(i, kernel);
		for (size_t j = 0; j < kernel_size; ++j)
		{
			nfa_state_t *n = kernel[j];
			switch (n->type)
			{
				case nfa_state_t::RAN:
				{
					nfa_state_t *m = n->value.ran.out;
					size_t c = 0;
					for (Range *r = n->value.ran.ran; r; r = r->next ())
					{
						for (; charset[c] != r->lower(); ++c);
						for (; charset[c] != r->upper(); ++c)
						{
							arcs[c].push_back(m);
						}
					}
					break;
				}
				case nfa_state_t::CTX:
					s->ctx = true;
					break;
				case nfa_state_t::FIN:
					s2rules[i].insert(n->value.fin.rule);
					break;
				default:
					break;
			}
		}

		s->arcs = new size_t[nchars];
		for(size_t c = 0; c < nchars; ++c)
		{
			nfa_state_t **end = buffer;
			for (std::vector<nfa_state_t*>::const_iterator j = arcs[c].begin(); j != arcs[c].end(); ++j)
			{
				end = closure(end, *j);
			}
			s->arcs[c] = find_state(buffer, end, kernels);
		}

		for(size_t c = 0; c < nchars; ++c)
		{
			arcs[c].clear();
		}
	}
	delete[] buffer;

	const size_t count = states.size();
	for (size_t i = 0; i < count; ++i)
	{
		dfa_state_t *s = states[i];
		std::set<RuleOp*> &rs = s2rules[i];
		// for each final state: choose the rule with the smallest rank
		for (std::set<RuleOp*>::const_iterator j = rs.begin(); j != rs.end(); ++j)
		{
			RuleOp *rule = *j;
			if (!s->rule || rule->rank < s->rule->rank)
			{
				s->rule = rule;
			}
		}
		// other rules are shadowed by the chosen rule
		for (std::set<RuleOp*>::const_iterator j = rs.begin(); j != rs.end(); ++j)
		{
			RuleOp *rule = *j;
			if (s->rule != rule)
			{
				rules[rule->rank].shadow.insert(s->rule->rank);
			}
		}
	}
}